

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTTPSocket.cpp
# Opt level: O1

HTTPParser * __thiscall uWS::HTTPParser::operator++(HTTPParser *this,int param_1)

{
  long lVar1;
  int iVar2;
  char *pcVar3;
  unsigned_long uVar4;
  char *pcVar5;
  
  pcVar5 = this->cursor;
  while ((pcVar3 = pcVar5 + 1, *pcVar5 != '\r' || (*pcVar3 != '\n'))) {
    this->cursor = pcVar3;
    pcVar5 = pcVar3;
  }
  pcVar3 = pcVar5 + 2;
  this->cursor = pcVar3;
  if ((pcVar5[2] == '\r') && (pcVar5[3] == '\n')) {
    (this->value).first = (char *)0x0;
    (this->value).second = 0;
    (this->key).first = (char *)0x0;
    (this->key).second = 0;
  }
  else {
    uVar4 = 0;
    for (pcVar5 = pcVar3; (*pcVar5 != '\r' && (*pcVar5 != ':')); pcVar5 = pcVar5 + 1) {
      uVar4 = uVar4 + 1;
    }
    (this->key).first = pcVar3;
    (this->key).second = uVar4;
    if (*pcVar5 == '\r') {
      (this->value).first = (char *)0x0;
      (this->value).second = 0;
    }
    else {
      this->cursor = pcVar5;
      do {
        pcVar3 = pcVar5;
        this->cursor = pcVar3 + 1;
        iVar2 = isspace((int)pcVar3[1]);
        pcVar5 = pcVar3 + 1;
      } while (iVar2 != 0);
      uVar4 = 0xffffffffffffffff;
      do {
        lVar1 = uVar4 + 2;
        uVar4 = uVar4 + 1;
      } while (pcVar3[lVar1] != '\r');
      (this->value).first = pcVar3 + 1;
      (this->value).second = uVar4;
    }
  }
  return this;
}

Assistant:

HTTPParser &operator++(int)
    {
        size_t length = 0;
        for (; !(cursor[0] == '\r' && cursor[1] == '\n'); cursor++);
        cursor += 2;
        if (cursor[0] == '\r' && cursor[1] == '\n') {
            key = value = {0, 0};
        } else {
            for (; cursor[length] != ':' && cursor[length] != '\r'; length++);
            key = {cursor, length};
            if (cursor[length] != '\r') {
                cursor += length;
                length = 0;
                while (isspace(*(++cursor)));
                for (; cursor[length] != '\r'; length++);
                value = {cursor, length};
            } else {
                value = {0, 0};
            }
        }
        return *this;
    }